

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O2

bool __thiscall QSystemSemaphore::release(QSystemSemaphore *this,int n)

{
  bool bVar1;
  long in_FS_OFFSET;
  QMessageLogger local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (n == 0) {
    bVar1 = true;
  }
  else {
    if (-1 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        bVar1 = QSystemSemaphorePrivate::modifySemaphore
                          ((this->d)._M_t.
                           super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
                           .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl,n);
        return bVar1;
      }
      goto LAB_0020a1db;
    }
    local_30.context.version = 2;
    local_30.context.function._4_4_ = 0;
    local_30.context._4_8_ = 0;
    local_30.context._12_8_ = 0;
    local_30.context.category = "default";
    bVar1 = false;
    QMessageLogger::warning(&local_30,"QSystemSemaphore::release: n is negative.");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
LAB_0020a1db:
  __stack_chk_fail();
}

Assistant:

bool QSystemSemaphore::release(int n)
{
    if (n == 0)
        return true;
    if (n < 0) {
        qWarning("QSystemSemaphore::release: n is negative.");
        return false;
    }
    return d->modifySemaphore(n);
}